

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlp.cpp
# Opt level: O2

void __thiscall
seeta::fd::MLP::AddLayer
          (MLP *this,int32_t inputDim,int32_t outputDim,float *weights,float *bias,bool is_output)

{
  pointer psVar1;
  MLPLayer *__p;
  shared_ptr<seeta::fd::MLPLayer> layer;
  
  psVar1 = (this->layers_).
           super__Vector_base<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((psVar1 == (this->layers_).
                 super__Vector_base<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) ||
     ((psVar1[-1].super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      output_dim_ == inputDim)) {
    __p = (MLPLayer *)operator_new(0x40);
    __p->act_func_type_ = (uint)!is_output;
    __p->input_dim_ = 0;
    __p->output_dim_ = 0;
    (__p->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->weights_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__p->bias_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__p->bias_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    (__p->bias_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__shared_ptr<seeta::fd::MLPLayer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<seeta::fd::MLPLayer,void>
              ((__shared_ptr<seeta::fd::MLPLayer,(__gnu_cxx::_Lock_policy)2> *)&layer,__p);
    MLPLayer::SetSize(layer.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,inputDim,outputDim);
    MLPLayer::SetWeights
              (layer.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               weights,inputDim * outputDim);
    MLPLayer::SetBias(layer.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,bias,outputDim);
    std::
    vector<std::shared_ptr<seeta::fd::MLPLayer>,_std::allocator<std::shared_ptr<seeta::fd::MLPLayer>_>_>
    ::push_back(&this->layers_,&layer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&layer.super___shared_ptr<seeta::fd::MLPLayer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void MLP::AddLayer(int32_t inputDim, int32_t outputDim, const float* weights,
    const float* bias, bool is_output) {
  if (layers_.size() > 0 && inputDim != layers_.back()->GetOutputDim())
    return;  // @todo handle the errors!!!

  std::shared_ptr<seeta::fd::MLPLayer> layer(new seeta::fd::MLPLayer(is_output ? 0 : 1));
  layer->SetSize(inputDim, outputDim);
  layer->SetWeights(weights, inputDim * outputDim);
  layer->SetBias(bias, outputDim);
  layers_.push_back(layer);
}